

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

void __thiscall cornerstone::buffer::put(buffer *this,string *str)

{
  uint uVar1;
  long lVar2;
  overflow_error *this_00;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = uVar1 & 0x7fffffff;
  }
  else {
    uVar3 = (uint)*(ushort *)this;
  }
  if ((int)uVar1 < 0) {
    uVar5 = *(uint *)(this + 4);
  }
  else {
    uVar5 = (uint)*(ushort *)(this + 2);
  }
  if (str->_M_string_length + 1 <= (ulong)uVar3 - (ulong)uVar5) {
    if ((int)uVar1 < 0) {
      lVar2 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar2 = (ulong)*(ushort *)(this + 2) + 4;
    }
    uVar6 = str->_M_string_length;
    if (uVar6 != 0) {
      uVar4 = 0;
      do {
        (this + lVar2)[uVar4] = *(buffer *)((str->_M_dataplus)._M_p + uVar4);
        uVar4 = uVar4 + 1;
        uVar6 = str->_M_string_length;
      } while (uVar4 < uVar6);
    }
    (this + lVar2)[uVar6] = (buffer)0x0;
    if (*(int *)this < 0) {
      *(int *)(this + 4) = (int)str->_M_string_length + *(int *)(this + 4) + 1;
    }
    else {
      *(short *)(this + 2) = (short)str->_M_string_length + *(short *)(this + 2) + 1;
    }
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer to store a string");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}